

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* parse_comma_int_array_list(char *s)

{
  int iVar1;
  char *in_RSI;
  value_type *in_RDI;
  vector<int,_std::allocator<int>_> ai;
  int nscan;
  int nconsumed;
  int v;
  char *pch;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *aai;
  value_type *this;
  int local_2c;
  int local_28;
  undefined1 local_24 [4];
  char *local_20;
  undefined1 local_11;
  char *local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17b475);
  local_20 = strtok(local_10,"[]");
  while (local_20 != (char *)0x0) {
    local_28 = 0;
    iVar1 = __isoc99_sscanf(local_20,"%d%n",local_24,&local_28);
    if (iVar1 == 1) {
      local_20 = local_20 + local_28;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17b4ec);
      std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
      local_2c = __isoc99_sscanf(local_20,",%d%n",local_24,&local_28);
      while (local_2c == 1) {
        local_20 = local_20 + local_28;
        std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict1 *)in_RDI);
        local_2c = __isoc99_sscanf(local_20,",%d%n",local_24,&local_28);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)this,in_RDI);
      std::vector<int,_std::allocator<int>_>::~vector(this);
    }
    local_20 = strtok((char *)0x0,"[]");
  }
  return (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)this;
}

Assistant:

static std::vector<std::vector<int> > parse_comma_int_array_list(char* s)
{
    std::vector<std::vector<int> > aai;

    char* pch = strtok(s, "[]");
    while (pch != NULL)
    {
        // parse a,b,c
        int v;
        int nconsumed = 0;
        int nscan = sscanf(pch, "%d%n", &v, &nconsumed);
        if (nscan == 1)
        {
            // ok we get array
            pch += nconsumed;

            std::vector<int> ai;
            ai.push_back(v);

            nscan = sscanf(pch, ",%d%n", &v, &nconsumed);
            while (nscan == 1)
            {
                pch += nconsumed;

                ai.push_back(v);

                nscan = sscanf(pch, ",%d%n", &v, &nconsumed);
            }

            // array end
            aai.push_back(ai);
        }

        pch = strtok(NULL, "[]");
    }

    return aai;
}